

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformation::GetOSDescription_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream local_190 [8];
  ostringstream oss;
  SystemInformation *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = GetOSName(this);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2," ");
  pcVar1 = GetOSRelease(this);
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2," ");
  pcVar1 = GetOSVersion(this);
  std::operator<<(poVar2,pcVar1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemInformation::GetOSDescription()
{
  kwsys_ios::ostringstream oss;
  oss
    << this->GetOSName()
    << " "
    << this->GetOSRelease()
    << " "
    << this->GetOSVersion();

  return oss.str();
}